

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexManager.cpp
# Opt level: O3

void __thiscall Indexing::IndexManager::IndexManager(IndexManager *this,SaturationAlgorithm *alg)

{
  UnificationWithAbstraction UVar1;
  
  this->_alg = alg;
  (this->_store)._timestamp = 1;
  (this->_store)._size = 0;
  (this->_store)._deleted = 0;
  (this->_store)._capacityIndex = 0;
  (this->_store)._capacity = 0;
  *(undefined8 *)&(this->_store)._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(this->_store)._entries + 4) = 0;
  *(undefined4 *)((long)&(this->_store)._afterLast + 4) = 0;
  UVar1 = Kernel::AbstractionOracle::create();
  this->_uwa = UVar1;
  this->_uwaFixedPointIteration = *(bool *)(Lib::env + 0xa992);
  return;
}

Assistant:

IndexManager::IndexManager(SaturationAlgorithm* alg)
  : _alg(alg)
  , _uwa(AbstractionOracle::create())
  , _uwaFixedPointIteration(env.options->unificationWithAbstractionFixedPointIteration())
{ }